

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

Vec_Ptr_t * Prs_ManReadVerilog(char *pFileName)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  Prs_Man_t *p;
  FILE *__stream;
  long lVar4;
  char *pcVar5;
  Abc_Nam_t *pAVar6;
  Hash_IntMan_t *pHVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  int extraout_EDX;
  int extraout_EDX_00;
  int fSlices;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  byte *pbVar15;
  undefined8 extraout_RDX;
  undefined8 uVar16;
  undefined8 extraout_RDX_00;
  uint uVar17;
  uint uVar18;
  long lVar19;
  byte *pbVar20;
  
  p = (Prs_Man_t *)calloc(1,0x4c0);
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      puts("Cannot open input file.");
      return (Vec_Ptr_t *)0x0;
    }
    fseek(__stream,0,2);
    lVar4 = ftell(__stream);
    rewind(__stream);
    lVar19 = lVar4 << 0x20;
    pcVar5 = (char *)malloc(lVar19 + 0x1000000000 >> 0x20);
    *pcVar5 = '\n';
    fread(pcVar5 + 1,(long)(int)lVar4,1,__stream);
    fclose(__stream);
    pcVar5[lVar19 + 0x100000000 >> 0x20] = '\n';
    pcVar5[lVar19 + 0x200000000 >> 0x20] = '\0';
    p->pName = pFileName;
    p->pBuffer = pcVar5;
    p->pLimit = pcVar5 + (long)(int)lVar4 + 3;
    p->pCur = pcVar5;
  }
  pAVar6 = Abc_NamStart(1000,0x18);
  p->pStrs = pAVar6;
  pAVar6 = Abc_NamStart(100,0x18);
  p->pFuns = pAVar6;
  pHVar7 = (Hash_IntMan_t *)calloc(1,0x18);
  uVar18 = 1099;
  while( true ) {
    do {
      uVar17 = uVar18;
      uVar18 = uVar17 + 1;
    } while ((uVar17 & 1) != 0);
    if (uVar18 < 9) break;
    iVar14 = 5;
    while (uVar18 % (iVar14 - 2U) != 0) {
      uVar3 = iVar14 * iVar14;
      iVar14 = iVar14 + 2;
      if (uVar18 < uVar3) goto LAB_003b856d;
    }
  }
LAB_003b856d:
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar17) {
    uVar3 = uVar18;
  }
  pVVar8->nCap = uVar3;
  piVar9 = (int *)malloc((long)(int)uVar3 << 2);
  pVVar8->pArray = piVar9;
  pVVar8->nSize = uVar18;
  if (piVar9 != (int *)0x0) {
    memset(piVar9,0,(long)(int)uVar18 << 2);
  }
  pHVar7->vTable = pVVar8;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x1130;
  piVar9 = (int *)malloc(0x44c0);
  pVVar8->pArray = piVar9;
  pHVar7->vObjs = pVVar8;
  piVar9[0] = 0;
  piVar9[1] = 0;
  piVar9[2] = 0;
  piVar9[3] = 0;
  pVVar8->nSize = 4;
  pHVar7->nRefs = 1;
  p->vHash = pHVar7;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(800);
  pVVar10->pArray = ppvVar11;
  p->vNtks = pVVar10;
  Abc_NamStrFindOrAdd(pAVar6,"1\'b0",(int *)0x0);
  Abc_NamStrFindOrAdd(p->pFuns,"1\'b1",(int *)0x0);
  Abc_NamStrFindOrAdd(p->pFuns,"1\'bx",(int *)0x0);
  Abc_NamStrFindOrAdd(p->pFuns,"1\'bz",(int *)0x0);
  Prs_NtkAddVerilogDirectives(p);
  if (p->pNtk == (Prs_Ntk_t *)0x0) {
    pbVar15 = (byte *)p->pLimit;
    pbVar20 = (byte *)p->pCur;
    if (pbVar20 < pbVar15) {
LAB_003b86dd:
      uVar12 = (ulong)*pbVar20;
      if (uVar12 < 0x30) {
        if ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0) {
          pbVar20 = pbVar20 + 1;
          p->pCur = (char *)pbVar20;
          goto LAB_003b86dd;
        }
        if (uVar12 != 0x2f) goto LAB_003b8856;
        if (pbVar20[1] == 0x2a) {
          pbVar20 = pbVar20 + 2;
          p->pCur = (char *)pbVar20;
          if (pbVar20 < pbVar15) {
            do {
              if ((*pbVar20 == 0x2a) && (pbVar20[1] == 0x2f)) {
                pbVar20 = pbVar20 + 2;
                goto LAB_003b8771;
              }
              pbVar20 = pbVar20 + 1;
              p->pCur = (char *)pbVar20;
            } while (pbVar20 != pbVar15);
          }
        }
        else if (pbVar20[1] == 0x2f) {
          pbVar20 = pbVar20 + 2;
          p->pCur = (char *)pbVar20;
          if (pbVar20 < pbVar15) {
            do {
              bVar13 = *pbVar20;
              pbVar20 = pbVar20 + 1;
              if (bVar13 == 10) goto LAB_003b8771;
              p->pCur = (char *)pbVar20;
            } while (pbVar20 != pbVar15);
          }
        }
      }
LAB_003b882f:
      bVar13 = *pbVar20;
      if (bVar13 == 0x60) {
        pcVar5 = strchr((char *)pbVar20,10);
        if (pcVar5 != (char *)0x0) {
          pbVar20 = (byte *)(pcVar5 + 1);
          p->pCur = (char *)pbVar20;
        }
        do {
          if (pbVar15 <= pbVar20) goto LAB_003b8bd2;
          while( true ) {
            uVar12 = (ulong)*pbVar20;
            if (0x2f < uVar12) goto LAB_003b882f;
            if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) break;
            pbVar20 = pbVar20 + 1;
            p->pCur = (char *)pbVar20;
          }
          if (uVar12 != 0x2f) goto LAB_003b8856;
          if (pbVar20[1] == 0x2a) {
            pbVar20 = pbVar20 + 2;
            p->pCur = (char *)pbVar20;
            if (pbVar15 <= pbVar20) goto LAB_003b882f;
            while ((*pbVar20 != 0x2a || (pbVar20[1] != 0x2f))) {
              pbVar20 = pbVar20 + 1;
              p->pCur = (char *)pbVar20;
              if (pbVar20 == pbVar15) goto LAB_003b882f;
            }
            pbVar20 = pbVar20 + 2;
          }
          else {
            if (pbVar20[1] != 0x2f) goto LAB_003b882f;
            pbVar20 = pbVar20 + 2;
            p->pCur = (char *)pbVar20;
            if (pbVar15 <= pbVar20) goto LAB_003b882f;
            while (bVar13 = *pbVar20, pbVar20 = pbVar20 + 1, bVar13 != 10) {
              p->pCur = (char *)pbVar20;
              if (pbVar20 == pbVar15) goto LAB_003b882f;
            }
          }
          p->pCur = (char *)pbVar20;
        } while( true );
      }
      if (bVar13 != 0x5c) {
        if ((bVar13 == 0x5f) || (0xe5 < (byte)((bVar13 & 0xdf) + 0xa5))) {
          pbVar15 = pbVar20 + 1;
          do {
            do {
              p->pCur = (char *)pbVar15;
              bVar13 = *pbVar15;
              pbVar15 = pbVar15 + 1;
            } while (0xf5 < (byte)(bVar13 - 0x3a));
          } while (((bVar13 == 0x24) || (bVar13 == 0x5f)) || (0xe5 < (byte)((bVar13 & 0xdf) + 0xa5))
                  );
          goto LAB_003b8896;
        }
LAB_003b8e62:
        if (p->ErrorStr[0] != '\0') goto LAB_003b8edf;
        builtin_strncpy(p->ErrorStr,"Cannot read \"module\" keyword.",0x1e);
        goto LAB_003b8c08;
      }
      pbVar20 = pbVar20 + 1;
      pbVar15 = pbVar20;
      do {
        p->pCur = (char *)pbVar15;
        bVar13 = *pbVar15;
        pbVar15 = pbVar15 + 1;
      } while (bVar13 != 0x20);
LAB_003b8896:
      iVar14 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar20,(char *)(pbVar15 + -1),(int *)0x0);
      if (iVar14 != 6) goto LAB_003b8e62;
      pbVar15 = (byte *)p->pLimit;
      pbVar20 = (byte *)p->pCur;
      do {
        if (pbVar15 <= pbVar20) {
LAB_003b8e2e:
          if (p->ErrorStr[0] != '\0') goto LAB_003b8edf;
          builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
          goto LAB_003b8c08;
        }
        while( true ) {
          bVar13 = *pbVar20;
          uVar12 = (ulong)bVar13;
          if (0x2f < uVar12) goto LAB_003b8943;
          if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) break;
          pbVar20 = pbVar20 + 1;
          p->pCur = (char *)pbVar20;
        }
        if (uVar12 != 0x2f) goto LAB_003b895d;
        if (pbVar20[1] == 0x2a) {
          pbVar20 = pbVar20 + 2;
          p->pCur = (char *)pbVar20;
          if (pbVar15 <= pbVar20) {
LAB_003b8941:
            bVar13 = *pbVar20;
            goto LAB_003b8943;
          }
          while ((*pbVar20 != 0x2a || (pbVar20[1] != 0x2f))) {
            pbVar20 = pbVar20 + 1;
            p->pCur = (char *)pbVar20;
            if (pbVar20 == pbVar15) goto LAB_003b8941;
          }
          pbVar20 = pbVar20 + 2;
        }
        else {
          if (pbVar20[1] != 0x2f) {
            bVar13 = 0x2f;
            goto LAB_003b896a;
          }
          pbVar20 = pbVar20 + 2;
          p->pCur = (char *)pbVar20;
          if (pbVar15 <= pbVar20) goto LAB_003b8941;
          while (bVar13 = *pbVar20, pbVar20 = pbVar20 + 1, bVar13 != 10) {
            p->pCur = (char *)pbVar20;
            if (pbVar20 == pbVar15) goto LAB_003b8941;
          }
        }
        p->pCur = (char *)pbVar20;
      } while( true );
    }
LAB_003b8bd2:
    if (p->ErrorStr[0] != '\0') goto LAB_003b8edf;
    p->ErrorStr[0x10] = 'c';
    p->ErrorStr[0x11] = 'h';
    p->ErrorStr[0x12] = 'e';
    p->ErrorStr[0x13] = 'd';
    p->ErrorStr[0x14] = ' ';
    p->ErrorStr[0x15] = 'e';
    p->ErrorStr[0x16] = 'n';
    p->ErrorStr[0x17] = 'd';
    p->ErrorStr[0x18] = '-';
    p->ErrorStr[0x19] = 'o';
    p->ErrorStr[0x1a] = 'f';
    p->ErrorStr[0x1b] = '-';
    p->ErrorStr[0x1c] = 'f';
    p->ErrorStr[0x1d] = 'i';
    p->ErrorStr[0x1e] = 'l';
    p->ErrorStr[0x1f] = 'e';
    p->ErrorStr[0] = 'U';
    p->ErrorStr[1] = 'n';
    p->ErrorStr[2] = 'e';
    p->ErrorStr[3] = 'x';
    p->ErrorStr[4] = 'p';
    p->ErrorStr[5] = 'e';
    p->ErrorStr[6] = 'c';
    p->ErrorStr[7] = 't';
    p->ErrorStr[8] = 'e';
    p->ErrorStr[9] = 'd';
    p->ErrorStr[10] = 'l';
    p->ErrorStr[0xb] = 'y';
    p->ErrorStr[0xc] = ' ';
    p->ErrorStr[0xd] = 'r';
    p->ErrorStr[0xe] = 'e';
    p->ErrorStr[0xf] = 'a';
    p->ErrorStr[0x20] = '.';
    p->ErrorStr[0x21] = '\0';
    p->ErrorStr[0] = '\0';
  }
  else {
LAB_003b8674:
    if (p->ErrorStr[0] != '\0') {
LAB_003b8edf:
      __assert_fail("!p->ErrorStr[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaPrs.h"
                    ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
    }
    builtin_strncpy(p->ErrorStr,"Parsing previous module is unfinished.",0x27);
  }
LAB_003b8c08:
  Prs_ManPrintModules(p);
  if (p->ErrorStr[0] == '\0') {
    pVVar10 = p->vNtks;
    p->vNtks = (Vec_Ptr_t *)0x0;
  }
  else {
    pcVar5 = p->pBuffer;
    uVar12 = 0;
    if (pcVar5 < p->pCur) {
      uVar12 = 0;
      do {
        uVar12 = (ulong)((int)uVar12 + (uint)(*pcVar5 == '\n'));
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != p->pCur);
    }
    pVVar10 = (Vec_Ptr_t *)0x0;
    printf("Line %d: %s\n",uVar12,p->ErrorStr);
  }
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  if (p->pFuns != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pFuns);
  }
  pHVar7 = p->vHash;
  if (pHVar7 != (Hash_IntMan_t *)0x0) {
    piVar9 = &pHVar7->nRefs;
    *piVar9 = *piVar9 + -1;
    if (*piVar9 == 0) {
      pVVar8 = pHVar7->vObjs;
      piVar9 = pVVar8->pArray;
      if (piVar9 != (int *)0x0) {
        free(piVar9);
      }
      free(pVVar8);
      pVVar8 = pHVar7->vTable;
      piVar9 = pVVar8->pArray;
      if (piVar9 != (int *)0x0) {
        free(piVar9);
      }
      free(pVVar8);
      free(pHVar7);
    }
  }
  if (p->vNtks != (Vec_Ptr_t *)0x0) {
    Prs_ManVecFree(p->vNtks);
  }
  pcVar5 = (p->vCover).pArray;
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
    (p->vCover).pArray = (char *)0x0;
  }
  (p->vCover).nCap = 0;
  (p->vCover).nSize = 0;
  piVar9 = (p->vTemp).pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
    (p->vTemp).pArray = (int *)0x0;
  }
  (p->vTemp).nCap = 0;
  (p->vTemp).nSize = 0;
  piVar9 = (p->vTemp2).pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
    (p->vTemp2).pArray = (int *)0x0;
  }
  (p->vTemp2).nCap = 0;
  (p->vTemp2).nSize = 0;
  piVar9 = (p->vTemp3).pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
    (p->vTemp3).pArray = (int *)0x0;
  }
  (p->vTemp3).nCap = 0;
  (p->vTemp3).nSize = 0;
  piVar9 = (p->vTemp4).pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
    (p->vTemp4).pArray = (int *)0x0;
  }
  (p->vTemp4).nCap = 0;
  (p->vTemp4).nSize = 0;
  piVar9 = (p->vKnown).pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
    (p->vKnown).pArray = (int *)0x0;
  }
  (p->vKnown).nCap = 0;
  (p->vKnown).nSize = 0;
  piVar9 = (p->vFailed).pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
    (p->vFailed).pArray = (int *)0x0;
  }
  (p->vFailed).nCap = 0;
  (p->vFailed).nSize = 0;
  piVar9 = (p->vSucceeded).pArray;
  if (piVar9 != (int *)0x0) {
    free(piVar9);
    (p->vSucceeded).pArray = (int *)0x0;
  }
  (p->vSucceeded).nCap = 0;
  (p->vSucceeded).nSize = 0;
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
  }
  free(p);
  return pVVar10;
LAB_003b8771:
  p->pCur = (char *)pbVar20;
LAB_003b8775:
  if (pbVar15 <= pbVar20) goto LAB_003b8bd2;
  goto LAB_003b86dd;
LAB_003b8856:
  if (uVar12 == 0) goto LAB_003b8bd2;
  goto LAB_003b882f;
LAB_003b895d:
  if (uVar12 == 0) goto LAB_003b8e2e;
LAB_003b8943:
  if (bVar13 != 0x5c) {
LAB_003b896a:
    if ((bVar13 == 0x5f) || (iVar14 = extraout_EDX, 0xe5 < (byte)((bVar13 & 0xdf) + 0xa5))) {
      pbVar15 = pbVar20 + 1;
      do {
        do {
          p->pCur = (char *)pbVar15;
          bVar13 = *pbVar15;
          pbVar15 = pbVar15 + 1;
        } while (0xf5 < (byte)(bVar13 - 0x3a));
      } while (((bVar13 == 0x24) || (bVar13 == 0x5f)) || (0xe5 < (byte)((bVar13 & 0xdf) + 0xa5)));
      goto LAB_003b89a3;
    }
LAB_003b8e8c:
    pcVar5 = "Cannot read module name.";
LAB_003b8ed2:
    Prs_ManErrorSet(p,pcVar5,iVar14);
    goto LAB_003b8c08;
  }
  pbVar20 = pbVar20 + 1;
  pbVar15 = pbVar20;
  do {
    p->pCur = (char *)pbVar15;
    bVar13 = *pbVar15;
    pbVar15 = pbVar15 + 1;
  } while (bVar13 != 0x20);
LAB_003b89a3:
  uVar18 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar20,(char *)(pbVar15 + -1),(int *)0x0);
  iVar14 = extraout_EDX_00;
  if (uVar18 == 0) goto LAB_003b8e8c;
  pcVar5 = Abc_NamStr(p->pStrs,uVar18);
  iVar14 = Prs_ManIsKnownModule(pcVar5);
  if (iVar14 != 0) {
    iVar14 = Prs_ManUtilSkipUntilWord(p,"endmodule");
    if (iVar14 != 0) {
      pcVar5 = "Cannot find \"endmodule\" keyword.";
      iVar14 = extraout_EDX_01;
      goto LAB_003b8ed2;
    }
    Vec_IntPush(&p->vKnown,uVar18);
    if (p->pNtk == (Prs_Ntk_t *)0x0) {
LAB_003b89fe:
      pbVar15 = (byte *)p->pLimit;
      pbVar20 = (byte *)p->pCur;
      goto LAB_003b8775;
    }
    goto LAB_003b8674;
  }
  uVar12 = (ulong)uVar18;
  Prs_ManInitializeNtk(p,uVar18,fSlices);
  iVar14 = Prs_ManUtilSkipSpaces(p);
  if (iVar14 != 0) goto LAB_003b8c08;
  if (*p->pCur != '(') {
    pcVar5 = "Cannot find \"(\" in the argument declaration.";
    iVar14 = extraout_EDX_02;
    goto LAB_003b8ed2;
  }
  iVar14 = Prs_ManReadArguments(p);
  if (iVar14 == 0) goto LAB_003b8c08;
  if (*p->pCur != ')') {
    __assert_fail("*p->pCur == \')\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x4d4,"int Prs_ManReadModule(Prs_Man_t *)");
  }
  p->pCur = p->pCur + 1;
  iVar14 = Prs_ManUtilSkipSpaces(p);
  if (iVar14 != 0) goto LAB_003b8c08;
  bVar2 = false;
  uVar16 = extraout_RDX;
  do {
    iVar14 = (int)uVar16;
    if (*p->pCur != ';' && !bVar2) {
      pcVar5 = "Cannot find \";\" in the module definition.";
      goto LAB_003b8ed2;
    }
    if (!bVar2) {
      p->pCur = p->pCur + 1;
    }
    iVar14 = Prs_ManUtilSkipSpaces(p);
    if (iVar14 != 0) goto LAB_003b8c08;
    uVar18 = Prs_ManReadName(p);
    if (uVar18 == 0x10) {
      Vec_IntPush(&p->vSucceeded,p->pNtk->iModuleName);
      if (p->pNtk == (Prs_Ntk_t *)0x0) {
        __assert_fail("p->pNtk != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaPrs.h"
                      ,0xe2,"void Prs_ManFinalizeNtk(Prs_Man_t *)");
      }
      p->pNtk = (Prs_Ntk_t *)0x0;
      goto LAB_003b89fe;
    }
    if (uVar18 - 1 < 5) {
      if (uVar18 == 5) {
        uVar18 = 4;
      }
      uVar12 = (ulong)uVar18;
      iVar14 = Prs_ManReadDeclaration(p,uVar18);
      goto LAB_003b8ac2;
    }
    switch(uVar18) {
    case 7:
      while( true ) {
        uVar18 = Prs_ManReadSignal(p);
        iVar14 = extraout_EDX_03;
        if (uVar18 == 0) {
          pcVar5 = "Cannot read output in assign-statement.";
          goto LAB_003b8ed2;
        }
        if (*p->pCur != '=') {
          pcVar5 = "Expecting \"=\" in assign-statement.";
          goto LAB_003b8ed2;
        }
        p->pCur = p->pCur + 1;
        iVar14 = Prs_ManUtilSkipSpaces(p);
        if (iVar14 != 0) {
          pcVar5 = "Error number 23.";
          iVar14 = extraout_EDX_04;
          goto LAB_003b8ed2;
        }
        uVar12 = (ulong)uVar18;
        iVar14 = Prs_ManReadExpression(p,uVar18);
        if (iVar14 == 0) goto LAB_003b8c08;
        cVar1 = *p->pCur;
        if (cVar1 != ',') break;
        p->pCur = p->pCur + 1;
        iVar14 = Prs_ManUtilSkipSpaces(p);
        if (iVar14 != 0) {
          pcVar5 = "Error number 23a.";
          iVar14 = extraout_EDX_05;
          goto LAB_003b8ed2;
        }
      }
      if (cVar1 != ';') {
        __assert_fail("Prs_ManIsChar(p, \',\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x4f8,"int Prs_ManReadModule(Prs_Man_t *)");
      }
      bVar2 = false;
      goto LAB_003b8b7d;
    case 8:
      iVar14 = Prs_ManReadAlways(p);
      break;
    case 9:
      iVar14 = Prs_ManReadFunction(p);
      break;
    case 10:
      iVar14 = Prs_ManUtilSkipUntil(p,(char)uVar12);
      goto LAB_003b8ac2;
    default:
      uVar12 = (ulong)uVar18;
      iVar14 = Prs_ManReadInstance(p,uVar18);
LAB_003b8ac2:
      bVar2 = false;
      goto LAB_003b8b75;
    }
    bVar2 = true;
LAB_003b8b75:
    if (iVar14 == 0) goto LAB_003b8c08;
LAB_003b8b7d:
    iVar14 = Prs_ManUtilSkipSpaces(p);
    uVar16 = extraout_RDX_00;
    if (iVar14 != 0) goto LAB_003b8c08;
  } while( true );
}

Assistant:

Vec_Ptr_t * Prs_ManReadVerilog( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Prs_Man_t * p = Prs_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Abc_NamStrFindOrAdd( p->pFuns, "1\'b0", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'b1", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'bx", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, "1\'bz", NULL );
    Prs_NtkAddVerilogDirectives( p );
    Prs_ManReadDesign( p );   
    Prs_ManPrintModules( p );
    if ( Prs_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Prs_ManFree( p );
    return vPrs;
}